

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3DetectionOutput::~Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  undefined8 *in_RDI;
  Layer *this_00;
  
  *in_RDI = &PTR__Yolov3DetectionOutput_01fd8510;
  puVar3 = in_RDI + 0x2e;
  if (in_RDI[0x2f] != 0) {
    piVar2 = (int *)in_RDI[0x2f];
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (in_RDI[0x32] == 0) {
        if ((void *)*puVar3 != (void *)0x0) {
          free((void *)*puVar3);
        }
      }
      else {
        (**(code **)(*(long *)in_RDI[0x32] + 0x18))((long *)in_RDI[0x32],*puVar3);
      }
    }
  }
  *puVar3 = 0;
  in_RDI[0x30] = 0;
  *(undefined4 *)(in_RDI + 0x31) = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  *(undefined4 *)((long)in_RDI + 0x19c) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)((long)in_RDI + 0x1a4) = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x2f] = 0;
  this_00 = (Layer *)(in_RDI + 0x25);
  if (in_RDI[0x26] != 0) {
    piVar2 = (int *)in_RDI[0x26];
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (in_RDI[0x29] == 0) {
        if (this_00->_vptr_Layer != (_func_int **)0x0) {
          free(this_00->_vptr_Layer);
        }
      }
      else {
        (**(code **)(*(long *)in_RDI[0x29] + 0x18))((long *)in_RDI[0x29],this_00->_vptr_Layer);
      }
    }
  }
  this_00->_vptr_Layer = (_func_int **)0x0;
  this_00->support_tensor_storage = false;
  this_00->support_reserved_00 = false;
  this_00->support_reserved_0 = false;
  this_00->support_reserved_1 = false;
  this_00->support_reserved_2 = false;
  this_00->support_reserved_3 = false;
  this_00->support_reserved_4 = false;
  this_00->support_reserved_5 = false;
  this_00->support_reserved_6 = false;
  this_00->support_reserved_7 = false;
  this_00->support_reserved_8 = false;
  this_00->support_reserved_9 = false;
  this_00->typeindex = 0;
  *(undefined4 *)&this_00->field_0x2c = 0;
  *(undefined4 *)&this_00->type = 0;
  *(undefined4 *)&(this_00->type).field_0x4 = 0;
  *(undefined4 *)&(this_00->type)._M_string_length = 0;
  (this_00->type).field_2._M_allocated_capacity = 0;
  this_00->one_blob_only = false;
  this_00->support_inplace = false;
  this_00->support_vulkan = false;
  this_00->support_packing = false;
  this_00->support_bf16_storage = false;
  this_00->support_fp16_storage = false;
  this_00->support_int8_storage = false;
  this_00->support_image_storage = false;
  puVar3 = in_RDI + 0x1c;
  if (in_RDI[0x1d] != 0) {
    piVar2 = (int *)in_RDI[0x1d];
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (in_RDI[0x20] == 0) {
        if ((void *)*puVar3 != (void *)0x0) {
          free((void *)*puVar3);
        }
      }
      else {
        (**(code **)(*(long *)in_RDI[0x20] + 0x18))((long *)in_RDI[0x20],*puVar3);
      }
    }
  }
  *puVar3 = 0;
  in_RDI[0x1e] = 0;
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  *(undefined4 *)((long)in_RDI + 0x10c) = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  *(undefined4 *)((long)in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x1d] = 0;
  Layer::~Layer(this_00);
  return;
}

Assistant:

Yolov3DetectionOutput::~Yolov3DetectionOutput()
{
    //delete softmax;
}